

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

bool ImGui::DragBehaviorT<double,double,double>
               (ImGuiDataType data_type,double *v,float v_speed,double v_min,double v_max,
               char *format,float power,ImGuiDragFlags flags)

{
  bool bVar1;
  bool bVar2;
  ImGuiContext *pIVar3;
  bool bVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  float fVar8;
  double dVar9;
  double dVar10;
  float fVar11;
  float fVar12;
  double local_48;
  ImVec2 local_38;
  
  pIVar3 = GImGui;
  uVar6 = data_type & 0xfffffffe;
  bVar1 = false;
  if ((v_min < v_max) && (((bVar1 = false, power != 1.0 || (NAN(power))) && (uVar6 == 8)))) {
    bVar1 = v_max - v_min < 3.4028234663852886e+38;
  }
  if (v_max < v_min) {
    return false;
  }
  if (((v_speed == 0.0) && (!NAN(v_speed))) &&
     ((v_min < v_max && (v_max - v_min < 3.4028234663852886e+38)))) {
    v_speed = (float)((v_max - v_min) * (double)GImGui->DragSpeedDefaultRatio);
  }
  uVar7 = flags & 1;
  if (((GImGui->ActiveIdSource != ImGuiInputSource_Mouse) ||
      (bVar4 = IsMousePosValid((ImVec2 *)0x0), !bVar4)) ||
     ((pIVar3->IO).MouseDragMaxDistanceSqr[0] <= 1.0)) {
    fVar12 = 0.0;
    if (pIVar3->ActiveIdSource == ImGuiInputSource_Nav) {
      uVar5 = 0;
      if (uVar6 == 8) {
        uVar5 = ImParseFormatPrecision(format,3);
      }
      local_38 = GetNavInputAmount2d(3,ImGuiInputReadMode_RepeatFast,0.1,10.0);
      fVar12 = (&local_38.x)[uVar7];
      if ((int)uVar5 < 0) {
        fVar11 = 1.1754944e-38;
      }
      else if ((int)uVar5 < 10) {
        fVar11 = *(float *)(GetMinimumStepAtDecimalPrecision(int)::min_steps + (ulong)uVar5 * 4);
      }
      else {
        fVar11 = powf(10.0,(float)(int)-uVar5);
      }
      v_speed = (float)((uint)v_speed & -(uint)(fVar11 <= v_speed) |
                       ~-(uint)(fVar11 <= v_speed) & (uint)fVar11);
    }
  }
  else {
    fVar12 = (pIVar3->IO).NavInputs[(ulong)uVar7 + 0x1d];
    if ((pIVar3->IO).KeyAlt != false) {
      fVar12 = fVar12 * 0.01;
    }
    if ((pIVar3->IO).KeyShift == true) {
      fVar12 = fVar12 * 10.0;
    }
  }
  fVar12 = fVar12 * v_speed;
  fVar11 = fVar12;
  if (uVar7 != 0) {
    fVar11 = -fVar12;
  }
  if (v_min < v_max) {
    if ((*v < v_max) || (bVar4 = true, fVar11 <= 0.0)) {
      bVar4 = fVar11 < 0.0 && *v <= v_min;
    }
  }
  else {
    bVar4 = false;
  }
  if (bVar1) {
    if ((0.0 <= fVar11) || (bVar2 = true, pIVar3->DragCurrentAccum <= 0.0)) {
      if (fVar11 <= 0.0) goto LAB_0017510d;
      bVar2 = pIVar3->DragCurrentAccum <= 0.0 && pIVar3->DragCurrentAccum != 0.0;
    }
  }
  else {
LAB_0017510d:
    bVar2 = false;
  }
  if (((pIVar3->ActiveIdIsJustActivated & 1U) != 0 || bVar4) || (bVar2)) {
    pIVar3->DragCurrentAccum = 0.0;
    bVar4 = false;
  }
  else {
    if ((fVar12 == 0.0) && (!NAN(fVar12))) goto LAB_00175152;
    pIVar3->DragCurrentAccum = pIVar3->DragCurrentAccum + fVar11;
    bVar4 = true;
  }
  pIVar3->DragCurrentAccumDirty = bVar4;
LAB_00175152:
  if (pIVar3->DragCurrentAccumDirty != true) {
    return false;
  }
  if (bVar1) {
    dVar9 = v_max - v_min;
    local_48 = pow((*v - v_min) / dVar9,1.0 / (double)power);
    fVar8 = (float)((double)pIVar3->DragCurrentAccum / dVar9 + local_48);
    fVar12 = 1.0;
    if (fVar8 <= 1.0) {
      fVar12 = fVar8;
    }
    fVar12 = powf((float)(~-(uint)(fVar8 < 0.0) & (uint)fVar12),power);
    dVar9 = (double)fVar12 * dVar9 + v_min;
  }
  else {
    dVar9 = *v + (double)pIVar3->DragCurrentAccum;
    local_48 = 0.0;
  }
  dVar9 = RoundScalarWithFormatT<double,double>(format,data_type,dVar9);
  pIVar3->DragCurrentAccumDirty = false;
  if (bVar1) {
    dVar10 = pow((dVar9 - v_min) / (v_max - v_min),1.0 / (double)power);
    dVar10 = dVar10 - local_48;
  }
  else {
    dVar10 = dVar9 - *v;
  }
  pIVar3->DragCurrentAccum = pIVar3->DragCurrentAccum - (float)dVar10;
  dVar9 = (double)(~-(ulong)(dVar9 == 0.0) & (ulong)dVar9);
  dVar10 = *v;
  if (v_min < v_max) {
    if ((dVar10 != dVar9) || (NAN(dVar10) || NAN(dVar9))) {
      if ((dVar9 < v_min) || (((uVar6 != 8 && (dVar10 < dVar9)) && (fVar11 < 0.0)))) {
        dVar9 = v_min;
      }
      if ((v_max < dVar9) || (((uVar6 != 8 && (dVar9 < dVar10)) && (0.0 < fVar11)))) {
        dVar9 = v_max;
      }
    }
  }
  if ((dVar10 == dVar9) && (!NAN(dVar10) && !NAN(dVar9))) {
    return (bool)(-(dVar10 != dVar9) & 1);
  }
  *v = dVar9;
  return true;
}

Assistant:

bool ImGui::DragBehaviorT(ImGuiDataType data_type, TYPE* v, float v_speed, const TYPE v_min, const TYPE v_max, const char* format, float power, ImGuiDragFlags flags)
{
    ImGuiContext& g = *GImGui;
    const ImGuiAxis axis = (flags & ImGuiDragFlags_Vertical) ? ImGuiAxis_Y : ImGuiAxis_X;
    const bool is_decimal = (data_type == ImGuiDataType_Float) || (data_type == ImGuiDataType_Double);
    const bool is_clamped = (v_min < v_max);
    const bool is_power = (power != 1.0f && is_decimal && is_clamped && (v_max - v_min < FLT_MAX));
    const bool is_locked = (v_min > v_max);
    if (is_locked)
        return false;

    // Default tweak speed
    if (v_speed == 0.0f && is_clamped && (v_max - v_min < FLT_MAX))
        v_speed = (float)((v_max - v_min) * g.DragSpeedDefaultRatio);

    // Inputs accumulates into g.DragCurrentAccum, which is flushed into the current value as soon as it makes a difference with our precision settings
    float adjust_delta = 0.0f;
    if (g.ActiveIdSource == ImGuiInputSource_Mouse && IsMousePosValid() && g.IO.MouseDragMaxDistanceSqr[0] > 1.0f*1.0f)
    {
        adjust_delta = g.IO.MouseDelta[axis];
        if (g.IO.KeyAlt)
            adjust_delta *= 1.0f / 100.0f;
        if (g.IO.KeyShift)
            adjust_delta *= 10.0f;
    }
    else if (g.ActiveIdSource == ImGuiInputSource_Nav)
    {
        int decimal_precision = is_decimal ? ImParseFormatPrecision(format, 3) : 0;
        adjust_delta = GetNavInputAmount2d(ImGuiNavDirSourceFlags_Keyboard | ImGuiNavDirSourceFlags_PadDPad, ImGuiInputReadMode_RepeatFast, 1.0f / 10.0f, 10.0f)[axis];
        v_speed = ImMax(v_speed, GetMinimumStepAtDecimalPrecision(decimal_precision));
    }
    adjust_delta *= v_speed;

    // For vertical drag we currently assume that Up=higher value (like we do with vertical sliders). This may become a parameter.
    if (axis == ImGuiAxis_Y)
        adjust_delta = -adjust_delta;

    // Clear current value on activation
    // Avoid altering values and clamping when we are _already_ past the limits and heading in the same direction, so e.g. if range is 0..255, current value is 300 and we are pushing to the right side, keep the 300.
    bool is_just_activated = g.ActiveIdIsJustActivated;
    bool is_already_past_limits_and_pushing_outward = is_clamped && ((*v >= v_max && adjust_delta > 0.0f) || (*v <= v_min && adjust_delta < 0.0f));
    bool is_drag_direction_change_with_power = is_power && ((adjust_delta < 0 && g.DragCurrentAccum > 0) || (adjust_delta > 0 && g.DragCurrentAccum < 0));
    if (is_just_activated || is_already_past_limits_and_pushing_outward || is_drag_direction_change_with_power)
    {
        g.DragCurrentAccum = 0.0f;
        g.DragCurrentAccumDirty = false;
    }
    else if (adjust_delta != 0.0f)
    {
        g.DragCurrentAccum += adjust_delta;
        g.DragCurrentAccumDirty = true;
    }

    if (!g.DragCurrentAccumDirty)
        return false;

    TYPE v_cur = *v;
    FLOATTYPE v_old_ref_for_accum_remainder = (FLOATTYPE)0.0f;

    if (is_power)
    {
        // Offset + round to user desired precision, with a curve on the v_min..v_max range to get more precision on one side of the range
        FLOATTYPE v_old_norm_curved = ImPow((FLOATTYPE)(v_cur - v_min) / (FLOATTYPE)(v_max - v_min), (FLOATTYPE)1.0f / power);
        FLOATTYPE v_new_norm_curved = v_old_norm_curved + (g.DragCurrentAccum / (v_max - v_min));
        v_cur = v_min + (SIGNEDTYPE)ImPow(ImSaturate((float)v_new_norm_curved), power) * (v_max - v_min);
        v_old_ref_for_accum_remainder = v_old_norm_curved;
    }
    else
    {
        v_cur += (SIGNEDTYPE)g.DragCurrentAccum;
    }

    // Round to user desired precision based on format string
    v_cur = RoundScalarWithFormatT<TYPE, SIGNEDTYPE>(format, data_type, v_cur);

    // Preserve remainder after rounding has been applied. This also allow slow tweaking of values.
    g.DragCurrentAccumDirty = false;
    if (is_power)
    {
        FLOATTYPE v_cur_norm_curved = ImPow((FLOATTYPE)(v_cur - v_min) / (FLOATTYPE)(v_max - v_min), (FLOATTYPE)1.0f / power);
        g.DragCurrentAccum -= (float)(v_cur_norm_curved - v_old_ref_for_accum_remainder);
    }
    else
    {
        g.DragCurrentAccum -= (float)((SIGNEDTYPE)v_cur - (SIGNEDTYPE)*v);
    }

    // Lose zero sign for float/double
    if (v_cur == (TYPE)-0)
        v_cur = (TYPE)0;

    // Clamp values (+ handle overflow/wrap-around for integer types)
    if (*v != v_cur && is_clamped)
    {
        if (v_cur < v_min || (v_cur > *v && adjust_delta < 0.0f && !is_decimal))
            v_cur = v_min;
        if (v_cur > v_max || (v_cur < *v && adjust_delta > 0.0f && !is_decimal))
            v_cur = v_max;
    }

    // Apply result
    if (*v == v_cur)
        return false;
    *v = v_cur;
    return true;
}